

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.h
# Opt level: O2

void UnitTest::_UnitTest_Compare::print(char ch)

{
  ostream *poVar1;
  char *pcVar2;
  
  if (ch != '\n') {
    std::operator<<((ostream *)&std::cout,ch);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,'\n');
  pcVar2 = _unittest_fail();
  std::operator<<(poVar1,pcVar2);
  if (DAT_00107178 != '\0') {
    return;
  }
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_3ad6);
  return;
}

Assistant:

static void print(const char ch) {
    if (ch == '\n') {
      std::cout << '\n' << _unittest_fail();
      if (!global_unit_test_object_.vim_lines) {
        std::cout << "│ ";
      }
    } else {
      std::cout << ch;
    }
  }